

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O3

string * __thiscall
Account::GetCharacterList_abi_cxx11_(string *__return_storage_ptr__,Account *this)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  int iVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> char_name;
  stringstream ss;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pbVar5 = (this->m_characters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_characters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    iVar4 = 1;
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar2,pcVar2 + pbVar5->_M_string_length);
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1d8,local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      pbVar5 = pbVar5 + 1;
      iVar4 = iVar4 + 1;
    } while (pbVar5 != pbVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Account::GetCharacterList() {
    std::stringstream ss;
    int count = 0;
    for(auto char_name: m_characters) {
        ss << ++count << " " << char_name << "\r\n";
    }
    return ss.str();
}